

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

vm_obj_id_t CVmObjByteArray::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  vm_val_t *src_idx_00;
  unsigned_long start_idx;
  void *pvVar3;
  char *cnt_00;
  CVmObjByteArray *src_arr_00;
  vm_val_t *pvVar4;
  uint in_ESI;
  CVmObjByteArray *src_arr;
  unsigned_long src_cnt;
  unsigned_long src_idx;
  vm_val_t *cmap;
  char *str;
  vm_val_t *arg1;
  unsigned_long cnt;
  CVmObjByteArray *arr;
  vm_obj_id_t id;
  vm_val_t *in_stack_00000180;
  char *in_stack_00000188;
  vm_val_t *in_stack_00000190;
  vm_val_t *in_stack_ffffffffffffff98;
  vm_obj_id_t obj_id;
  CVmObjByteArray *in_stack_ffffffffffffffa0;
  CVmObjByteArray *local_40;
  
  if (in_ESI == 0) {
    err_throw(0);
  }
  src_idx_00 = CVmStack::get(0);
  if (src_idx_00->typ == VM_INT) {
    if (in_ESI != 1) {
      err_throw(0);
    }
    start_idx = (unsigned_long)(src_idx_00->val).intval;
    vVar1 = vm_new_id((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0
                      ,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    pvVar3 = CVmObject::operator_new
                       ((size_t)in_stack_ffffffffffffffa0,
                        (vm_obj_id_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    CVmObjByteArray(in_stack_ffffffffffffffa0,(unsigned_long)in_stack_ffffffffffffff98);
    fill_with((CVmObjByteArray *)CONCAT44(in_ESI,vVar1),(uchar)((ulong)pvVar3 >> 0x38),start_idx,
              (unsigned_long)src_idx_00);
  }
  else {
    cnt_00 = vm_val_t::get_as_string(in_stack_ffffffffffffff98);
    obj_id = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (cnt_00 == (char *)0x0) {
      if ((src_idx_00->typ != VM_OBJ) || (iVar2 = is_byte_array(0), iVar2 == 0)) {
        err_throw(0);
      }
      vm_objp(0);
      src_arr_00 = (CVmObjByteArray *)get_element_count((CVmObjByteArray *)0x318b9d);
      if (in_ESI != 1) {
        pvVar4 = CVmStack::get(1);
        if (pvVar4->typ != VM_INT) {
          err_throw(0);
        }
        pvVar4 = CVmStack::get(1);
        local_40 = (CVmObjByteArray *)(long)(pvVar4->val).intval;
        if (local_40 == (CVmObjByteArray *)0x0) {
          local_40 = (CVmObjByteArray *)0x1;
        }
        if (in_ESI < 3) {
          if (src_arr_00 < local_40) {
            src_arr_00 = (CVmObjByteArray *)0x0;
          }
          else {
            src_arr_00 = (CVmObjByteArray *)((long)src_arr_00 + (1 - (long)local_40));
          }
        }
        else {
          pvVar4 = CVmStack::get(2);
          if (pvVar4->typ != VM_INT) {
            err_throw(0);
          }
          pvVar4 = CVmStack::get(2);
          src_arr_00 = (CVmObjByteArray *)(long)(pvVar4->val).intval;
          if (3 < in_ESI) {
            err_throw(0);
          }
        }
      }
      vVar1 = vm_new_id((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                        (int)in_stack_ffffffffffffffa0,obj_id);
      pvVar3 = CVmObject::operator_new((size_t)in_stack_ffffffffffffffa0,obj_id);
      CVmObjByteArray(in_stack_ffffffffffffffa0,(unsigned_long)pvVar3);
      copy_from((CVmObjByteArray *)CONCAT44(in_ESI,vVar1),(unsigned_long)pvVar3,src_arr_00,
                (unsigned_long)src_idx_00,(unsigned_long)cnt_00);
    }
    else {
      if ((in_ESI == 0) || (2 < in_ESI)) {
        err_throw(0);
      }
      if (1 < in_ESI) {
        CVmStack::get(1);
      }
      CVmStack::get(0);
      vVar1 = create_from_string(in_stack_00000190,in_stack_00000188,in_stack_00000180);
    }
  }
  CVmStack::discard(in_ESI);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_stack(VMG_ const uchar **pc_ptr,
                                               uint argc)
{
    vm_obj_id_t id = VM_INVALID_OBJ;
    CVmObjByteArray *arr;
    unsigned long cnt;
    vm_val_t *arg1;
    const char *str;

    /* check our arguments */
    if (argc < 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* see what we have for the first argument */
    arg1 = G_stk->get(0);
    if (arg1->typ == VM_INT)
    {
        /* 
         *   it's a simple count argument - make sure we only have one
         *   argument 
         */
        if (argc != 1)
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* get the number of elements */
        cnt = (unsigned long)arg1->val.intval;

        /* create the array with the given number of elements */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        arr = new (vmg_ id) CVmObjByteArray(vmg_ cnt);

        /* set each element to zero */
        arr->fill_with(0, 1, cnt);
    }
    else if ((str = arg1->get_as_string(vmg0_)) != 0)
    {
        /*
         *   String argument - we're creating a byte array from the string.
         *   We can map it from a character set, or we can just stuff the
         *   character values into bytes.  Check arguments - we must have one
         *   or two of them (the string, and the optional character set) 
         */
        if (argc < 1 || argc > 2)
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* fetch the character mapper, if there is one */
        const vm_val_t *cmap = (argc >= 2 ? G_stk->get(1) : 0);

        /* create the byte array */
        id = create_from_string(vmg_ G_stk->get(0), str, cmap);
    }
    else if (arg1->typ == VM_OBJ && is_byte_array(vmg_ arg1->val.obj))
    {
        unsigned long src_idx;
        unsigned long src_cnt;

        /* remember the source array */
        CVmObjByteArray *src_arr =
            (CVmObjByteArray *)vm_objp(vmg_ arg1->val.obj);

        /* get the count from the array */
        src_cnt = src_arr->get_element_count();

        /* 
         *   check for the optional actual element count, and the optional
         *   starting index 
         */
        if (argc == 1)
        {
            /* no size specified - use the same size as the original */
            cnt = src_cnt;

            /* start at the first element */
            src_idx = 1;
        }
        else
        {
            /* make sure it's an integer */
            if (G_stk->get(1)->typ != VM_INT)
                err_throw(VMERR_INT_VAL_REQD);

            /* use the specified starting index */
            src_idx = (unsigned long)G_stk->get(1)->val.intval;

            /* if the index is below 1, force it to 1 */
            if (src_idx < 1)
                src_idx = 1;

            /* check for the starting element argument */
            if (argc >= 3)
            {
                /* make sure it's an integer */
                if (G_stk->get(2)->typ != VM_INT)
                    err_throw(VMERR_INT_VAL_REQD);

                /* use the specified element count */
                cnt = (unsigned long)G_stk->get(2)->val.intval;

                /* make sure we don't have any extra arguments */
                if (argc > 3)
                    err_throw(VMERR_WRONG_NUM_OF_ARGS);
            }
            else
            {
                /* 
                 *   no count specified - use the number of elements in the
                 *   original remaining after the starting index 
                 */
                if (src_idx > src_cnt)
                    cnt = 0;
                else
                    cnt = src_cnt + 1 - src_idx;
            }
        }

        /* create the new array */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        arr = new (vmg_ id) CVmObjByteArray(vmg_ cnt);

        /* copy the source array */
        arr->copy_from(1, src_arr, src_idx, cnt);
    }
    else
    {
        /* invalid argument */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new object */
    return id;
}